

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTCue_Pause(FACTCue *pCue,int32_t fPause)

{
  uint32_t uVar1;
  int in_ESI;
  long in_RDI;
  uint8_t i;
  uint in_stack_ffffffffffffffe8;
  byte bVar2;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = 1;
  }
  else {
    FAudio_PlatformLockMutex((FAudioMutex)0x113a09);
    if ((*(uint *)(in_RDI + 0x3c) & 0x30) == 0) {
      uVar1 = FAudio_timems();
      *(uint32_t *)(in_RDI + 0xac) = (uVar1 - *(int *)(in_RDI + 0xa8)) + *(int *)(in_RDI + 0xac);
      if (in_ESI == 0) {
        *(uint *)(in_RDI + 0x3c) = *(uint *)(in_RDI + 0x3c) & 0xffffffbf;
      }
      else {
        *(uint *)(in_RDI + 0x3c) = *(uint *)(in_RDI + 0x3c) | 0x40;
      }
      if (*(long *)(in_RDI + 0x40) == 0) {
        if (*(long *)(in_RDI + 0x48) != 0) {
          for (in_stack_ffffffffffffffe8 = in_stack_ffffffffffffffe8 & 0xffffff;
              bVar2 = (byte)(in_stack_ffffffffffffffe8 >> 0x18),
              bVar2 < *(byte *)(**(long **)(in_RDI + 0x48) + 0xb);
              in_stack_ffffffffffffffe8 =
                   CONCAT13((char)(in_stack_ffffffffffffffe8 >> 0x18) + '\x01',
                            (int3)in_stack_ffffffffffffffe8)) {
            if (*(long *)(*(long *)(*(long *)(in_RDI + 0x48) + 8) + (ulong)bVar2 * 0x68 + 0x28) != 0
               ) {
              FACTWave_Pause((FACTWave *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),0);
            }
          }
        }
      }
      else {
        FACTWave_Pause((FACTWave *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),0);
      }
      FAudio_PlatformUnlockMutex((FAudioMutex)0x113b43);
      local_4 = 0;
    }
    else {
      FAudio_PlatformUnlockMutex((FAudioMutex)0x113a30);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

uint32_t FACTCue_Pause(FACTCue *pCue, int32_t fPause)
{
	uint8_t i;
	if (pCue == NULL)
	{
		return 1;
	}

	FAudio_PlatformLockMutex(pCue->parentBank->parentEngine->apiLock);

	/* "A stopping or stopped cue cannot be paused." */
	if (pCue->state & (FACT_STATE_STOPPING | FACT_STATE_STOPPED))
	{
		FAudio_PlatformUnlockMutex(
			pCue->parentBank->parentEngine->apiLock
		);
		return 0;
	}

	/* Store elapsed time */
	pCue->elapsed += FAudio_timems() - pCue->start;

	/* All we do is set the flag, not much to see here */
	if (fPause)
	{
		pCue->state |= FACT_STATE_PAUSED;
	}
	else
	{
		pCue->state &= ~FACT_STATE_PAUSED;
	}

	/* Pause the Waves */
	if (pCue->simpleWave != NULL)
	{
		FACTWave_Pause(pCue->simpleWave, fPause);
	}
	else if (pCue->playingSound != NULL)
	{
		for (i = 0; i < pCue->playingSound->sound->trackCount; i += 1)
		{
			if (pCue->playingSound->tracks[i].activeWave.wave != NULL)
			{
				FACTWave_Pause(
					pCue->playingSound->tracks[i].activeWave.wave,
					fPause
				);
			}
		}
	}

	FAudio_PlatformUnlockMutex(pCue->parentBank->parentEngine->apiLock);
	return 0;
}